

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ArrayFeatureType_EnumeratedShapes::Clear
          (ArrayFeatureType_EnumeratedShapes *this)

{
  uint32_t cached_has_bits;
  ArrayFeatureType_EnumeratedShapes *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::Clear
            (&this->shapes_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ArrayFeatureType_EnumeratedShapes::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ArrayFeatureType.EnumeratedShapes)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  shapes_.Clear();
  _internal_metadata_.Clear<std::string>();
}